

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void andres::marray_detail::
     OperateHelperUnary<(unsigned_short)6,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
     ::operate(View<int,_false,_std::allocator<unsigned_long>_> *v,long param_2)

{
  size_t sVar1;
  size_t j;
  ulong uVar2;
  
  uVar2 = 0;
  while( true ) {
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
    if (sVar1 <= uVar2) break;
    OperateHelperUnary<(unsigned_short)5,_andres::marray_detail::PrefixDecrement<int>,_int,_std::allocator<unsigned_long>_>
    ::operate(v,param_2);
    sVar1 = View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
    param_2 = param_2 + sVar1 * 4;
    uVar2 = uVar2 + 1;
  }
  View<int,_false,_std::allocator<unsigned_long>_>::shape(v,5);
  View<int,_false,_std::allocator<unsigned_long>_>::strides(v,5);
  return;
}

Assistant:

static inline void operate
    (
        View<T, false, A>& v, 
        Functor f, 
        T* data
    )
    {
        for(std::size_t j=0; j<v.shape(N-1); ++j) {
            OperateHelperUnary<N-1, Functor, T, A>::operate(v, f, data);
            data += v.strides(N-1);
        }
        data -= v.shape(N-1) * v.strides(N-1);
    }